

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# x_connective.c
# Opt level: O1

void * select_new(t_symbol *s,int argc,t_atom *argv)

{
  t_atomtype tVar1;
  word wVar2;
  t_object *owner;
  _outlet *p_Var3;
  _binbuf *p_Var4;
  _gobj **sp;
  t_symbol *ptVar5;
  int which;
  t_float tVar6;
  t_atom a;
  t_atom local_40;
  
  if (argc == 0) {
    argv = &local_40;
    local_40.a_type = A_FLOAT;
    local_40.a_w.w_float = 0.0;
    argc = 1;
  }
  if (argc == 1) {
    owner = (t_object *)pd_new(sel1_class);
    wVar2 = argv->a_w;
    owner[1].te_g.g_pd = *(t_pd *)argv;
    owner[1].te_g.g_next = (_gobj *)wVar2;
    p_Var3 = outlet_new(owner,&s_bang);
    owner[1].te_binbuf = (_binbuf *)p_Var3;
    sp = &owner[1].te_g.g_next;
    if (argv->a_type != A_FLOAT) {
      symbolinlet_new(owner,(t_symbol **)sp);
      ptVar5 = &s_symbol;
      goto LAB_0017d8ab;
    }
    floatinlet_new(owner,(t_float *)sp);
  }
  else {
    owner = (t_object *)pd_new(sel2_class);
    owner[1].te_g.g_next = (_gobj *)(long)argc;
    p_Var4 = (_binbuf *)getbytes((long)argc << 4);
    owner[1].te_binbuf = p_Var4;
    *(t_atomtype *)&owner[1].te_g.g_pd = argv->a_type;
    if (0 < argc) {
      which = 0;
      do {
        p_Var3 = outlet_new(owner,&s_bang);
        p_Var4->b_vec = (t_atom *)p_Var3;
        tVar1 = argv->a_type;
        *(t_atomtype *)&owner[1].te_g.g_pd = tVar1;
        if (tVar1 == A_FLOAT) {
          tVar6 = atom_getfloatarg(which,argc,argv);
          p_Var4->b_n = (int)tVar6;
        }
        else {
          ptVar5 = atom_getsymbolarg(which,argc,argv);
          *(t_symbol **)p_Var4 = ptVar5;
        }
        which = which + 1;
        p_Var4 = p_Var4 + 1;
      } while (argc != which);
    }
  }
  ptVar5 = &s_float;
LAB_0017d8ab:
  p_Var3 = outlet_new(owner,ptVar5);
  owner[1].te_outlet = p_Var3;
  return owner;
}

Assistant:

static void *select_new(t_symbol *s, int argc, t_atom *argv)
{
    t_atom a;
    if (argc == 0)
    {
        argc = 1;
        SETFLOAT(&a, 0);
        argv = &a;
    }
    if (argc == 1)
    {
        t_sel1 *x = (t_sel1 *)pd_new(sel1_class);
        x->x_atom = *argv;
        x->x_outlet1 = outlet_new(&x->x_obj, &s_bang);
        if (argv->a_type == A_FLOAT)
        {
            floatinlet_new(&x->x_obj, &x->x_atom.a_w.w_float);
            x->x_outlet2 = outlet_new(&x->x_obj, &s_float);
        }
        else
        {
            symbolinlet_new(&x->x_obj, &x->x_atom.a_w.w_symbol);
            x->x_outlet2 = outlet_new(&x->x_obj, &s_symbol);
        }
        return (x);
    }
    else
    {
        int n;
        t_selectelement *e;
        t_sel2 *x = (t_sel2 *)pd_new(sel2_class);
        x->x_nelement = argc;
        x->x_vec = (t_selectelement *)getbytes(argc * sizeof(*x->x_vec));
        x->x_type = argv[0].a_type;
        for (n = 0, e = x->x_vec; n < argc; n++, e++)
        {
            e->e_outlet = outlet_new(&x->x_obj, &s_bang);
            if ((x->x_type = argv->a_type) == A_FLOAT)
                e->e_w.w_float = atom_getfloatarg(n, argc, argv);
            else e->e_w.w_symbol = atom_getsymbolarg(n, argc, argv);
        }
        x->x_rejectout = outlet_new(&x->x_obj, &s_float);
        return (x);
    }

}